

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
               Target *target,ROMFetcher *rom_fetcher)

{
  DMA *dma;
  PCSpeaker *this_00;
  PIC *pic;
  Memory *pMVar1;
  RTC *pRVar2;
  bool bVar3;
  iterator iVar4;
  undefined4 *puVar5;
  size_t sVar6;
  Name font;
  Name tick;
  Name bios;
  type *local_140;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  Request request;
  Request local_a8;
  Request local_80;
  Request local_58;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0058a848;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0058a5c0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0058a648;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0058a690;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0058a6a8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0058a6d8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0058a718;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0058a730;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0058a768;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0058a780;
  (this->pic_).eoi_target_ = 0;
  (this->pic_).requests_ = '\0';
  (this->pic_).in_service_ = '\0';
  (this->pic_).single_pic_ = false;
  (this->pic_).four_byte_vectors_ = false;
  (this->pic_).level_triggered_ = false;
  (this->pic_).auto_eoi_ = false;
  (this->pic_).auto_eoi_ = false;
  (this->pic_).vector_base_ = '\0';
  (this->pic_).mask_ = '\0';
  (this->pic_).awaiting_eoi_ = false;
  dma = &this->dma_;
  i8237::i8237(&dma->controller);
  this_00 = &this->speaker_;
  PCSpeaker::PCSpeaker(this_00);
  local_140 = &this->video_;
  MDA::MDA(local_140);
  pic = &this->pic_;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keyboard_).pic_ = pic;
  (this->keyboard_).reset_delay_ = 0;
  FloppyController::FloppyController(&this->fdc_,pic,dma,1);
  (this->pit_observer_).pic_ = pic;
  (this->pit_observer_).speaker_ = this_00;
  (this->ppi_handler_).high_switches_observed_ = false;
  (this->ppi_handler_).high_switches_ = '\a';
  (this->ppi_handler_).low_switches_ = '\r';
  (this->ppi_handler_).use_high_switches_ = false;
  (this->ppi_handler_).speaker_ = this_00;
  (this->ppi_handler_).keyboard_ = &this->keyboard_;
  (this->ppi_handler_).enable_keyboard_ = false;
  i8253<false,_PCCompatible::PITObserver>::i8253(&this->pit_,&this->pit_observer_);
  (this->ppi_).control_ = '\0';
  (this->ppi_).outputs_[0] = '\0';
  (this->ppi_).outputs_[1] = '\0';
  (this->ppi_).outputs_[2] = '\0';
  (this->ppi_).port_handler_ = &this->ppi_handler_;
  (this->rtc_).ram_._M_elems[0] = '\0';
  (this->rtc_).ram_._M_elems[1] = '\0';
  (this->rtc_).ram_._M_elems[2] = '\0';
  (this->rtc_).ram_._M_elems[3] = '\0';
  (this->rtc_).ram_._M_elems[4] = '\0';
  (this->rtc_).ram_._M_elems[5] = '\0';
  (this->rtc_).ram_._M_elems[6] = '\0';
  (this->rtc_).ram_._M_elems[7] = '\0';
  pRVar2 = &this->rtc_;
  (pRVar2->ram_)._M_elems[8] = '\0';
  (pRVar2->ram_)._M_elems[9] = '\0';
  (pRVar2->ram_)._M_elems[10] = '\0';
  (pRVar2->ram_)._M_elems[0xb] = '\0';
  (pRVar2->ram_)._M_elems[0xc] = '\0';
  (pRVar2->ram_)._M_elems[0xd] = '\0';
  (pRVar2->ram_)._M_elems[0xe] = '\0';
  (pRVar2->ram_)._M_elems[0xf] = '\0';
  pRVar2 = &this->rtc_;
  (pRVar2->ram_)._M_elems[0x10] = '\0';
  (pRVar2->ram_)._M_elems[0x11] = '\0';
  (pRVar2->ram_)._M_elems[0x12] = '\0';
  (pRVar2->ram_)._M_elems[0x13] = '\0';
  (pRVar2->ram_)._M_elems[0x14] = '\0';
  (pRVar2->ram_)._M_elems[0x15] = '\0';
  (pRVar2->ram_)._M_elems[0x16] = '\0';
  (pRVar2->ram_)._M_elems[0x17] = '\0';
  pRVar2 = &this->rtc_;
  (pRVar2->ram_)._M_elems[0x18] = '\0';
  (pRVar2->ram_)._M_elems[0x19] = '\0';
  (pRVar2->ram_)._M_elems[0x1a] = '\0';
  (pRVar2->ram_)._M_elems[0x1b] = '\0';
  (pRVar2->ram_)._M_elems[0x1c] = '\0';
  (pRVar2->ram_)._M_elems[0x1d] = '\0';
  (pRVar2->ram_)._M_elems[0x1e] = '\0';
  (pRVar2->ram_)._M_elems[0x1f] = '\0';
  pRVar2 = &this->rtc_;
  (pRVar2->ram_)._M_elems[0x20] = '\0';
  (pRVar2->ram_)._M_elems[0x21] = '\0';
  (pRVar2->ram_)._M_elems[0x22] = '\0';
  (pRVar2->ram_)._M_elems[0x23] = '\0';
  (pRVar2->ram_)._M_elems[0x24] = '\0';
  (pRVar2->ram_)._M_elems[0x25] = '\0';
  (pRVar2->ram_)._M_elems[0x26] = '\0';
  (pRVar2->ram_)._M_elems[0x27] = '\0';
  pRVar2 = &this->rtc_;
  (pRVar2->ram_)._M_elems[0x28] = '\0';
  (pRVar2->ram_)._M_elems[0x29] = '\0';
  (pRVar2->ram_)._M_elems[0x2a] = '\0';
  (pRVar2->ram_)._M_elems[0x2b] = '\0';
  (pRVar2->ram_)._M_elems[0x2c] = '\0';
  (pRVar2->ram_)._M_elems[0x2d] = '\0';
  (pRVar2->ram_)._M_elems[0x2e] = '\0';
  (pRVar2->ram_)._M_elems[0x2f] = '\0';
  *(undefined4 *)((this->rtc_).ram_._M_elems + 0x2f) = 0;
  (this->rtc_).statusB_ = '\x02';
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_0058a868;
  Context::Context(&this->context,&this->pit_,dma,&this->ppi_,pic,local_140,&this->fdc_,&this->rtc_)
  ;
  InstructionSet::x86::Decoder<(InstructionSet::x86::Model)0>::Decoder(&(this->decoder).decoder);
  this->decoded_ip_ = 0;
  this->speed_ = ApproximatelyOriginal;
  (this->decoded).first = 0;
  (this->decoded).second.operation_ = Invalid;
  (this->decoded).second.mem_exts_source_ = '\0';
  (this->decoded).second.source_data_dest_sib_ = 0;
  *(undefined8 *)(this->decoded).second.extensions_ = 0;
  this->speed_ = target->speed;
  pMVar1 = &(this->context).memory;
  (this->dma_).memory_ = pMVar1;
  (this->super_TimedMachine).clock_rate_ = 1193182.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>::set_input_rate
            (&(this->speaker_).speaker.
              super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>,1193182.0);
  bios = PCCompatibleGLaBIOS;
  tick = PCCompatibleGLaTICK;
  font = PCCompatibleMDAFont;
  ROM::Request::Request(&local_58,PCCompatibleGLaBIOS,false);
  ROM::Request::Request(&local_80,PCCompatibleGLaTICK,true);
  ROM::Request::operator&&((Request *)&roms,&local_58,&local_80);
  ROM::Request::Request(&local_a8,PCCompatibleMDAFont,false);
  ROM::Request::operator&&(&request,(Request *)&roms,&local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_a8.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_80.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_58.node.children);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar3 = ROM::Request::validate(&request,&roms);
  if (bVar3) {
    iVar4 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&bios);
    sVar6 = (long)iVar4._M_node[1]._M_left - (long)iVar4._M_node[1]._M_parent;
    if (sVar6 != 0) {
      memmove((void *)((long)pMVar1 + (0x100000 - sVar6)),iVar4._M_node[1]._M_parent,sVar6);
    }
    iVar4 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&tick);
    if ((_Rb_tree_header *)iVar4._M_node != &roms._M_t._M_impl.super__Rb_tree_header) {
      sVar6 = (long)iVar4._M_node[1]._M_left - (long)iVar4._M_node[1]._M_parent;
      if (sVar6 != 0) {
        memmove((this->context).memory.memory._M_elems + 0xd0000,iVar4._M_node[1]._M_parent,sVar6);
      }
    }
    iVar4 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&font);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar4._M_node[1]._M_parent)
    ;
    (this->video_).outputter_.ram = (this->context).memory.memory._M_elems + 0xb0000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->video_).outputter_.font,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
    (*(this->super_Machine)._vptr_Machine[7])(this,&(target->super_Target).media);
    std::
    _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&roms._M_t);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&request.node.children);
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(
			const Analyser::Static::PCCompatible::Target &target,
			const ROMMachine::ROMFetcher &rom_fetcher
		) :
			keyboard_(pic_),
			fdc_(pic_, dma_, DriveCount),
			pit_observer_(pic_, speaker_),
			ppi_handler_(speaker_, keyboard_, video, DriveCount),
			pit_(pit_observer_),
			ppi_(ppi_handler_),
			context(pit_, dma_, ppi_, pic_, video_, fdc_, rtc_)
		{
			// Capture speed.
			speed_ = target.speed;

			// Set up DMA source/target.
			dma_.set_memory(&context.memory);

			// Use clock rate as a MIPS count; keeping it as a multiple or divisor of the PIT frequency is easy.
			static constexpr int pit_frequency = 1'193'182;
			set_clock_rate(double(pit_frequency));
			speaker_.speaker.set_input_rate(double(pit_frequency));

			// Fetch the BIOS. [8088 only, for now]
			const auto bios = ROM::Name::PCCompatibleGLaBIOS;
			const auto tick = ROM::Name::PCCompatibleGLaTICK;
			const auto font = Video::FontROM;

			ROM::Request request = ROM::Request(bios) && ROM::Request(tick, true) && ROM::Request(font);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// A BIOS is mandatory.
			const auto &bios_contents = roms.find(bios)->second;
			context.memory.install(0x10'0000 - bios_contents.size(), bios_contents.data(), bios_contents.size());

			// If found, install GlaTICK at 0xd'0000.
			auto tick_contents = roms.find(tick);
			if(tick_contents != roms.end()) {
				context.memory.install(0xd'0000, tick_contents->second.data(), tick_contents->second.size());
			}

			// Give the video card something to read from.
			const auto &font_contents = roms.find(font)->second;
			video_.set_source(context.memory.at(Video::BaseAddress), font_contents);

			// ... and insert media.
			insert_media(target.media);
		}